

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnBrTableExpr
          (BinaryReaderInterp *this,Index num_targets,Index *target_depths,
          Index default_target_depth)

{
  string_view *psVar1;
  Index index;
  Index depth;
  Result RVar2;
  ulong uVar3;
  Index catch_drop_count;
  Index keep_count;
  Index drop_count;
  SharedValidator *local_130;
  Index local_124;
  TypeChecker *local_120;
  ulong local_118;
  Index *local_110;
  Location loc;
  Location loc_2;
  Var local_c0;
  Var local_78;
  
  local_130 = &this->validator_;
  loc.field_1.field_0.last_column = 0;
  loc.filename._M_len = (this->filename_)._M_len;
  loc.filename._M_str = (this->filename_)._M_str;
  loc.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_110 = target_depths;
  RVar2 = SharedValidator::BeginBrTable(local_130,&loc);
  if (RVar2.enum_ != Error) {
    psVar1 = &this->filename_;
    local_124 = default_target_depth;
    Istream::Emit(this->istream_,BrTable,num_targets);
    local_120 = &(this->validator_).typechecker_;
    local_118 = (ulong)num_targets;
    for (uVar3 = 0; depth = local_124, local_118 != uVar3; uVar3 = uVar3 + 1) {
      index = local_110[uVar3];
      loc.field_1.field_0.last_column = 0;
      loc.filename._M_len = psVar1->_M_len;
      loc.filename._M_str = (this->filename_)._M_str;
      loc.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
           ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
      loc_2.field_1.field_0.last_column = 0;
      loc_2.filename._M_len = psVar1->_M_len;
      loc_2.filename._M_str = (this->filename_)._M_str;
      loc_2.field_1.field_1.offset = loc.field_1.field_1.offset;
      Var::Var(&local_78,index,&loc_2);
      RVar2 = SharedValidator::OnBrTableTarget(local_130,&loc,&local_78);
      Var::~Var(&local_78);
      if (RVar2.enum_ == Error) {
        return (Result)Error;
      }
      RVar2 = GetBrDropKeepCount(this,index,&drop_count,&keep_count);
      if (RVar2.enum_ == Error) {
        return (Result)Error;
      }
      RVar2 = TypeChecker::GetCatchCount(local_120,index,&catch_drop_count);
      if (RVar2.enum_ == Error) {
        return (Result)Error;
      }
      Istream::Emit(this->istream_,InterpDropKeep,drop_count,keep_count);
      Istream::Emit(this->istream_,InterpCatchDrop,catch_drop_count);
      EmitBr(this,index,0,0,0);
    }
    loc.field_1.field_0.last_column = 0;
    loc.filename._M_len = psVar1->_M_len;
    loc.filename._M_str = (this->filename_)._M_str;
    loc.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
    loc_2.field_1.field_0.last_column = 0;
    loc_2.filename._M_len = psVar1->_M_len;
    loc_2.filename._M_str = (this->filename_)._M_str;
    loc_2.field_1.field_1.offset = loc.field_1.field_1.offset;
    Var::Var(&local_c0,local_124,&loc_2);
    RVar2 = SharedValidator::OnBrTableTarget(local_130,&loc,&local_c0);
    Var::~Var(&local_c0);
    if ((RVar2.enum_ != Error) &&
       (RVar2 = GetBrDropKeepCount(this,depth,&drop_count,&keep_count), RVar2.enum_ != Error)) {
      RVar2 = TypeChecker::GetCatchCount(local_120,depth,&catch_drop_count);
      if (RVar2.enum_ != Error) {
        Istream::EmitDropKeep(this->istream_,drop_count,keep_count);
        Istream::Emit(this->istream_,InterpCatchDrop,catch_drop_count);
        EmitBr(this,depth,0,0,0);
        loc.field_1.field_0.last_column = 0;
        loc.filename._M_len = psVar1->_M_len;
        loc.filename._M_str = (this->filename_)._M_str;
        loc.field_1.field_1.offset =
             (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
             ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
        RVar2 = SharedValidator::EndBrTable(local_130,&loc);
        return (Result)(uint)(RVar2.enum_ == Error);
      }
      return (Result)Error;
    }
  }
  return (Result)Error;
}

Assistant:

Result BinaryReaderInterp::OnBrTableExpr(Index num_targets,
                                         Index* target_depths,
                                         Index default_target_depth) {
  CHECK_RESULT(validator_.BeginBrTable(GetLocation()));
  Index drop_count, keep_count, catch_drop_count;
  istream_.Emit(Opcode::BrTable, num_targets);

  for (Index i = 0; i < num_targets; ++i) {
    Index depth = target_depths[i];
    CHECK_RESULT(
        validator_.OnBrTableTarget(GetLocation(), Var(depth, GetLocation())));
    CHECK_RESULT(GetBrDropKeepCount(depth, &drop_count, &keep_count));
    CHECK_RESULT(validator_.GetCatchCount(depth, &catch_drop_count));
    // Emit DropKeep directly (instead of using EmitDropKeep) so the
    // instruction has a fixed size. Same for CatchDrop as well.
    istream_.Emit(Opcode::InterpDropKeep, drop_count, keep_count);
    istream_.Emit(Opcode::InterpCatchDrop, catch_drop_count);
    EmitBr(depth, 0, 0, 0);
  }
  CHECK_RESULT(validator_.OnBrTableTarget(
      GetLocation(), Var(default_target_depth, GetLocation())));
  CHECK_RESULT(
      GetBrDropKeepCount(default_target_depth, &drop_count, &keep_count));
  CHECK_RESULT(
      validator_.GetCatchCount(default_target_depth, &catch_drop_count));
  // The default case doesn't need a fixed size, since it is never jumped over.
  istream_.EmitDropKeep(drop_count, keep_count);
  istream_.Emit(Opcode::InterpCatchDrop, catch_drop_count);
  EmitBr(default_target_depth, 0, 0, 0);

  CHECK_RESULT(validator_.EndBrTable(GetLocation()));
  return Result::Ok;
}